

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O0

void __thiscall cmComputeComponentGraph::TransferEdges(cmComputeComponentGraph *this)

{
  size_type __n;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *this_01;
  cmListFileBacktrace *__args_3;
  bool local_62;
  bool local_61;
  size_type local_60;
  size_t j_component;
  size_t j;
  cmGraphEdge *ni;
  const_iterator __end2;
  const_iterator __begin2;
  EdgeList *__range2;
  EdgeList *nl;
  size_t i_component;
  size_t i;
  size_t n;
  cmComputeComponentGraph *this_local;
  
  sVar2 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                    (&this->InputGraph->
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  for (i_component = 0; i_component < sVar2; i_component = i_component + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->TarjanComponents,i_component);
    __n = *pvVar3;
    this_00 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                         (&this->InputGraph->
                           super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                          i_component)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    __end2 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_00);
    ni = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                  *)&ni);
      if (!bVar1) break;
      j = (size_t)__gnu_cxx::
                  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                  ::operator*(&__end2);
      j_component = cmGraphEdge::operator_cast_to_unsigned_long((cmGraphEdge *)j);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->TarjanComponents,j_component);
      local_60 = *pvVar3;
      if (__n != local_60) {
        this_01 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                            (&(this->ComponentGraph).
                              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,__n);
        local_61 = cmGraphEdge::IsStrong((cmGraphEdge *)j);
        local_62 = cmGraphEdge::IsCross((cmGraphEdge *)j);
        __args_3 = cmGraphEdge::GetBacktrace((cmGraphEdge *)j);
        std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
        emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace_const&>
                  (this_01,&local_60,&local_61,&local_62,__args_3);
      }
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TransferEdges()
{
  // Map inter-component edges in the original graph to edges in the
  // component graph.
  size_t n = this->InputGraph.size();
  for (size_t i = 0; i < n; ++i) {
    size_t i_component = this->TarjanComponents[i];
    EdgeList const& nl = this->InputGraph[i];
    for (cmGraphEdge const& ni : nl) {
      size_t j = ni;
      size_t j_component = this->TarjanComponents[j];
      if (i_component != j_component) {
        // We do not attempt to combine duplicate edges, but instead
        // store the inter-component edges with suitable multiplicity.
        this->ComponentGraph[i_component].emplace_back(
          j_component, ni.IsStrong(), ni.IsCross(), ni.GetBacktrace());
      }
    }
  }
}